

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglNativeColorMappingTests.cpp
# Opt level: O0

deUint32 deqp::egl::anon_unknown_1::createGLES2Program(Functions *gl,TestLog *log)

{
  qpTestLog *pqVar1;
  char *pcVar2;
  deUint32 dVar3;
  undefined4 uVar4;
  deUint32 dVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  deBool dVar8;
  undefined8 uVar9;
  char *linkInfoLog;
  TestError *this;
  bool linkOk;
  allocator<char> local_1a9;
  string local_1a8;
  LogShader local_188;
  allocator<char> local_131;
  string local_130;
  LogShader local_110;
  undefined4 local_c0;
  undefined4 local_bc;
  deInt32 infoLogLength_2;
  deInt32 infoLogLength_1;
  deInt32 infoLogLength;
  string local_a8 [8];
  string programInfoLog;
  undefined1 local_80 [4];
  deInt32 linkStatus;
  string fragmentInfoLog;
  undefined1 local_58 [4];
  deInt32 fragmentCompileStatus;
  string vertexInfoLog;
  deInt32 vertexCompileStatus;
  deUint32 fragmentShader;
  deUint32 vertexShader;
  deUint32 program;
  char *fragmentShaderSource;
  char *vertexShaderSource;
  TestLog *log_local;
  Functions *gl_local;
  
  fragmentShaderSource =
       "attribute highp vec2 a_pos;\nvoid main (void)\n{\n\tgl_Position = vec4(a_pos, 0.0, 1.0);\n}"
  ;
  _vertexShader = "void main (void)\n{\n\tgl_FragColor = vec4(0.9, 0.1, 0.4, 1.0);\n}";
  vertexInfoLog.field_2._12_4_ = 0;
  vertexShaderSource = (char *)log;
  log_local = (TestLog *)gl;
  std::__cxx11::string::string((string *)local_58);
  std::__cxx11::string::string((string *)local_80);
  std::__cxx11::string::string(local_a8);
  dVar3 = (*(code *)log_local[0x79].m_log)();
  uVar4 = (*(code *)log_local[0x7e].m_log)(0x8b31);
  vertexInfoLog.field_2._12_4_ = (*(code *)log_local[0x7e].m_log)(0x8b30);
  dVar5 = (*(code *)log_local[0x100].m_log)();
  glu::checkError(dVar5,"Failed to create shaders and program",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGetFrameTimestampsTests.cpp"
                  ,0x157);
  (*(code *)log_local[599].m_log)(uVar4,1,&fragmentShaderSource,0);
  (*(code *)log_local[0x49].m_log)(uVar4);
  dVar5 = (*(code *)log_local[0x100].m_log)();
  glu::checkError(dVar5,"Failed to setup vertex shader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGetFrameTimestampsTests.cpp"
                  ,0x15b);
  (*(code *)log_local[599].m_log)(vertexInfoLog.field_2._12_4_,1,&vertexShader,0);
  (*(code *)log_local[0x49].m_log)(vertexInfoLog.field_2._12_4_);
  dVar5 = (*(code *)log_local[0x100].m_log)();
  glu::checkError(dVar5,"Failed to setup fragment shader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGetFrameTimestampsTests.cpp"
                  ,0x15f);
  infoLogLength_2 = 0;
  (*(code *)log_local[0x14e].m_log)(uVar4,0x8b81,(undefined1 *)((long)&vertexInfoLog.field_2 + 8));
  (*(code *)log_local[0x14e].m_log)(uVar4,0x8b84,&infoLogLength_2);
  std::__cxx11::string::resize((ulong)local_58,(char)infoLogLength_2);
  pqVar1 = log_local[0x14b].m_log;
  uVar6 = std::__cxx11::string::length();
  uVar9 = std::__cxx11::string::operator[]((ulong)local_58);
  (*(code *)pqVar1)(uVar4,uVar6,&infoLogLength_2,uVar9);
  dVar5 = (*(code *)log_local[0x100].m_log)();
  glu::checkError(dVar5,"Failed to get vertex shader compile info",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGetFrameTimestampsTests.cpp"
                  ,0x16a);
  std::__cxx11::string::resize((ulong)local_58);
  local_bc = 0;
  (*(code *)log_local[0x14e].m_log)
            (vertexInfoLog.field_2._12_4_,0x8b81,
             (undefined1 *)((long)&fragmentInfoLog.field_2 + 0xc));
  (*(code *)log_local[0x14e].m_log)(vertexInfoLog.field_2._12_4_,0x8b84,&local_bc);
  std::__cxx11::string::resize((ulong)local_80,(char)local_bc);
  uVar6 = vertexInfoLog.field_2._12_4_;
  pqVar1 = log_local[0x14b].m_log;
  uVar7 = std::__cxx11::string::length();
  uVar9 = std::__cxx11::string::operator[]((ulong)local_80);
  (*(code *)pqVar1)(uVar6,uVar7,&local_bc,uVar9);
  dVar5 = (*(code *)log_local[0x100].m_log)();
  glu::checkError(dVar5,"Failed to get fragment shader compile info",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGetFrameTimestampsTests.cpp"
                  ,0x178);
  std::__cxx11::string::resize((ulong)local_80);
  (*(code *)log_local[2].m_log)(dVar3,uVar4);
  (*(code *)log_local[2].m_log)(dVar3,vertexInfoLog.field_2._12_4_);
  (*(code *)log_local[0x19d].m_log)(dVar3);
  dVar5 = (*(code *)log_local[0x100].m_log)();
  glu::checkError(dVar5,"Failed to setup program",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGetFrameTimestampsTests.cpp"
                  ,0x180);
  local_c0 = 0;
  (*(code *)log_local[0x13b].m_log)
            (dVar3,0x8b82,(undefined1 *)((long)&programInfoLog.field_2 + 0xc));
  (*(code *)log_local[0x13b].m_log)(dVar3,0x8b84,&local_c0);
  std::__cxx11::string::resize((ulong)local_a8,(char)local_c0);
  pqVar1 = log_local[0x131].m_log;
  uVar6 = std::__cxx11::string::length();
  uVar9 = std::__cxx11::string::operator[]((ulong)local_a8);
  (*(code *)pqVar1)(dVar3,uVar6,&local_c0,uVar9);
  dVar5 = (*(code *)log_local[0x100].m_log)();
  glu::checkError(dVar5,"Failed to get program link info",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGetFrameTimestampsTests.cpp"
                  ,0x18b);
  std::__cxx11::string::resize((ulong)local_a8);
  pcVar2 = vertexShaderSource;
  if (((programInfoLog.field_2._12_4_ == 0) || (vertexInfoLog.field_2._8_4_ == 0)) ||
     (fragmentInfoLog.field_2._12_4_ == 0)) {
    linkOk = programInfoLog.field_2._12_4_ != 0;
    linkInfoLog = (char *)std::__cxx11::string::c_str();
    tcu::TestLog::startShaderProgram((TestLog *)pcVar2,linkOk,linkInfoLog);
    pcVar2 = vertexShaderSource;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_130,
               "attribute highp vec2 a_pos;\nvoid main (void)\n{\n\tgl_Position = vec4(a_pos, 0.0, 1.0);\n}"
               ,&local_131);
    tcu::LogShader::LogShader
              (&local_110,QP_SHADER_TYPE_VERTEX,&local_130,vertexInfoLog.field_2._8_4_ != 0,
               (string *)local_58);
    tcu::TestLog::operator<<((TestLog *)pcVar2,&local_110);
    tcu::LogShader::~LogShader(&local_110);
    std::__cxx11::string::~string((string *)&local_130);
    std::allocator<char>::~allocator(&local_131);
    pcVar2 = vertexShaderSource;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a8,
               "void main (void)\n{\n\tgl_FragColor = vec4(0.9, 0.1, 0.4, 1.0);\n}",&local_1a9);
    tcu::LogShader::LogShader
              (&local_188,QP_SHADER_TYPE_FRAGMENT,&local_1a8,fragmentInfoLog.field_2._12_4_ != 0,
               (string *)local_80);
    tcu::TestLog::operator<<((TestLog *)pcVar2,&local_188);
    tcu::LogShader::~LogShader(&local_188);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::allocator<char>::~allocator(&local_1a9);
    tcu::TestLog::endShaderProgram((TestLog *)vertexShaderSource);
  }
  (*(code *)log_local[0x8e].m_log)(uVar4);
  (*(code *)log_local[0x8e].m_log)(vertexInfoLog.field_2._12_4_);
  dVar5 = (*(code *)log_local[0x100].m_log)();
  glu::checkError(dVar5,"Failed to delete shaders",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGetFrameTimestampsTests.cpp"
                  ,0x19d);
  while( true ) {
    dVar8 = ::deGetFalse();
    if (((dVar8 != 0) || (programInfoLog.field_2._12_4_ == 0)) ||
       ((vertexInfoLog.field_2._8_4_ == 0 || (fragmentInfoLog.field_2._12_4_ == 0)))) break;
    dVar8 = ::deGetFalse();
    if (dVar8 == 0) {
      std::__cxx11::string::~string(local_a8);
      std::__cxx11::string::~string((string *)local_80);
      std::__cxx11::string::~string((string *)local_58);
      return dVar3;
    }
  }
  this = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this,(char *)0x0,
             "linkStatus != 0 && vertexCompileStatus != 0 && fragmentCompileStatus != 0",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGetFrameTimestampsTests.cpp"
             ,0x19f);
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

deUint32 createGLES2Program (const glw::Functions& gl, TestLog& log)
{
	const char* const vertexShaderSource =
	"attribute highp vec2 a_pos;\n"
	"void main (void)\n"
	"{\n"
	"\tgl_Position = vec4(a_pos, 0.0, 1.0);\n"
	"}";

	const char* const fragmentShaderSource =
	"uniform mediump vec4 u_color;\n"
	"void main (void)\n"
	"{\n"
	"\tgl_FragColor = u_color;\n"
	"}";

	deUint32	program			= 0;
	deUint32	vertexShader	= 0;
	deUint32	fragmentShader	= 0;

	deInt32		vertexCompileStatus;
	string		vertexInfoLog;
	deInt32		fragmentCompileStatus;
	string		fragmentInfoLog;
	deInt32		linkStatus;
	string		programInfoLog;

	try
	{
		program			= gl.createProgram();
		vertexShader	= gl.createShader(GL_VERTEX_SHADER);
		fragmentShader	= gl.createShader(GL_FRAGMENT_SHADER);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to create shaders and program");

		gl.shaderSource(vertexShader, 1, &vertexShaderSource, DE_NULL);
		gl.compileShader(vertexShader);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to setup vertex shader");

		gl.shaderSource(fragmentShader, 1, &fragmentShaderSource, DE_NULL);
		gl.compileShader(fragmentShader);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to setup fragment shader");

		{
			deInt32		infoLogLength = 0;

			gl.getShaderiv(vertexShader, GL_COMPILE_STATUS, &vertexCompileStatus);
			gl.getShaderiv(vertexShader, GL_INFO_LOG_LENGTH, &infoLogLength);

			vertexInfoLog.resize(infoLogLength, '\0');

			gl.getShaderInfoLog(vertexShader, (glw::GLsizei)vertexInfoLog.length(), &infoLogLength, &(vertexInfoLog[0]));
			GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to get vertex shader compile info");

			vertexInfoLog.resize(infoLogLength);
		}

		{
			deInt32		infoLogLength = 0;

			gl.getShaderiv(fragmentShader, GL_COMPILE_STATUS, &fragmentCompileStatus);
			gl.getShaderiv(fragmentShader, GL_INFO_LOG_LENGTH, &infoLogLength);

			fragmentInfoLog.resize(infoLogLength, '\0');

			gl.getShaderInfoLog(fragmentShader, (glw::GLsizei)fragmentInfoLog.length(), &infoLogLength, &(fragmentInfoLog[0]));
			GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to get fragment shader compile info");

			fragmentInfoLog.resize(infoLogLength);
		}

		gl.attachShader(program, vertexShader);
		gl.attachShader(program, fragmentShader);
		gl.linkProgram(program);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to setup program");

		{
			deInt32		infoLogLength = 0;

			gl.getProgramiv(program, GL_LINK_STATUS, &linkStatus);
			gl.getProgramiv(program, GL_INFO_LOG_LENGTH, &infoLogLength);

			programInfoLog.resize(infoLogLength, '\0');

			gl.getProgramInfoLog(program, (glw::GLsizei)programInfoLog.length(), &infoLogLength, &(programInfoLog[0]));
			GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to get program link info");

			programInfoLog.resize(infoLogLength);
		}

		if (linkStatus == 0 || vertexCompileStatus == 0 || fragmentCompileStatus == 0)
		{

			log.startShaderProgram(linkStatus != 0, programInfoLog.c_str());

			log << TestLog::Shader(QP_SHADER_TYPE_VERTEX, vertexShaderSource, vertexCompileStatus != 0, vertexInfoLog);
			log << TestLog::Shader(QP_SHADER_TYPE_FRAGMENT, fragmentShaderSource, fragmentCompileStatus != 0, fragmentInfoLog);

			log.endShaderProgram();
		}

		gl.deleteShader(vertexShader);
		gl.deleteShader(fragmentShader);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to delete shaders");

		TCU_CHECK(linkStatus != 0 && vertexCompileStatus != 0 && fragmentCompileStatus != 0);
	}
	catch (...)
	{
		if (program)
			gl.deleteProgram(program);

		if (vertexShader)
			gl.deleteShader(vertexShader);

		if (fragmentShader)
			gl.deleteShader(fragmentShader);

		throw;
	}

	return program;
}